

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::iterate
          (BinaryAtomicOperationCase *this)

{
  RenderContext *renderContext;
  ostringstream *poVar1;
  ChannelType CVar2;
  TextureType TVar3;
  AtomicOperation AVar4;
  AtomicOperationCaseType AVar5;
  AtomicOperationCaseType AVar6;
  TestLog *log;
  ChannelType CVar7;
  bool bVar8;
  int i;
  int iVar9;
  deUint32 dVar10;
  int iVar11;
  ContextType type;
  GLSLVersion version;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ObjectTraits *pOVar12;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar13;
  undefined4 extraout_var_05;
  long lVar14;
  undefined4 extraout_var_06;
  bool *pbVar15;
  size_t sVar16;
  long *plVar17;
  undefined8 *puVar18;
  ImageLayerVerifier *verifyLayer;
  int i_1;
  undefined8 uVar19;
  size_type *psVar20;
  long *plVar21;
  pointer pPVar22;
  ulong *puVar23;
  char *pcVar24;
  RenderContext *renderContext_00;
  bool *pbVar25;
  char *__s;
  ulong *puVar26;
  GLuint z;
  uint uVar27;
  TextureFormat TVar29;
  TextureFormat *pTVar30;
  RenderContext RVar31;
  undefined1 isSampler;
  deUint32 dVar32;
  TextureFormat *pTVar33;
  int iVar34;
  bool *pbVar35;
  BinaryAtomicOperationCase *pBVar36;
  bool bVar37;
  GLuint local_7b4;
  int local_7b0;
  int local_7a8 [4];
  BinaryAtomicOperationCase *local_798;
  string shaderImageFormatStr;
  string shaderImageTypeStr;
  ulong *local_750;
  long local_748;
  ulong local_740;
  long lStack_738;
  TextureFormat *local_730;
  value_type local_728;
  string atomicInvocation;
  long *local_6e8;
  long local_6e0;
  long local_6d8;
  long lStack_6d0;
  TestLog *local_6c8;
  string glslVersionDeclaration;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  TextureFormat *local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  long *local_658;
  long local_650;
  long local_648;
  long lStack_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  long *local_618;
  long local_610;
  long local_608;
  long lStack_600;
  ulong *local_5f8;
  long local_5f0;
  ulong local_5e8;
  long lStack_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  CallLogWrapper glLog;
  ulong *local_5a0;
  long local_598;
  ulong local_590;
  undefined8 uStack_588;
  string atomicCoord;
  RenderContext *local_560;
  long local_558;
  RenderContext local_550;
  undefined8 uStack_548;
  ChannelType local_53c;
  ulong *local_538;
  long local_530;
  ulong local_528;
  long lStack_520;
  ulong *local_518;
  long local_510;
  ulong local_508 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  long *local_4d8;
  undefined8 local_4d0;
  long local_4c8;
  undefined8 uStack_4c0;
  string atomicArgExpr;
  string colorVecTypeName;
  LayeredImage imageData;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_3e8;
  _Vector_impl_data local_3c8;
  string local_3a8;
  string local_388;
  pointer local_368;
  long local_360;
  undefined1 local_358 [16];
  pointer local_348;
  long local_340;
  undefined1 local_338 [16];
  Texture returnValueTexture;
  Texture endResultTexture;
  string invocationCoord;
  IVec4 initial;
  pointer local_2c8;
  pointer ppSStack_2c0;
  ios_base local_268 [8];
  ios_base local_260 [32];
  ChannelOrder local_240;
  bool local_218;
  TextureFormat *local_150;
  undefined8 local_148;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  Buffer returnValueTextureBuf;
  Buffer endResultTextureBuf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  
  pTVar33 = (TextureFormat *)((this->super_TestCase).m_context)->m_renderCtx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar9 = (**(_func_int **)((long)*pTVar33 + 0x18))(pTVar33);
  local_6c8 = log;
  glu::CallLogWrapper::CallLogWrapper(&glLog,(Functions *)CONCAT44(extraout_var,iVar9),log);
  dVar10 = glu::getInternalFormat(this->m_format);
  local_148 = CONCAT44(extraout_var_00,dVar10);
  switch(this->m_imageType) {
  case TEXTURETYPE_2D:
    local_7a8[0] = 0x40;
    local_7a8[1] = 0x40;
    local_7a8[3] = 0xde1;
    local_7b0 = 0x40;
    goto LAB_01482cef;
  case TEXTURETYPE_CUBE:
    local_7a8[0] = 0x40;
    local_7a8[1] = 0x40;
    local_7a8[2] = 1;
    local_7b4 = 6;
    bVar8 = true;
    local_7a8[3] = 0x8513;
    local_7b0 = 0x40;
    iVar9 = 1;
    iVar34 = 0x40;
    break;
  case TEXTURETYPE_2D_ARRAY:
    local_7a8[3] = 0x8c1a;
    goto LAB_01482c98;
  case TEXTURETYPE_3D:
    local_7a8[3] = 0x806f;
LAB_01482c98:
    local_7a8[2] = 8;
    local_7a8[0] = 0x40;
    local_7a8[1] = 0x40;
    bVar8 = true;
    local_7b0 = 0x40;
    iVar9 = 8;
    iVar34 = 0x40;
    local_7b4 = 8;
    break;
  default:
    local_7a8[2] = 0xffffffff;
    local_7a8[0] = -1;
    local_7a8[1] = -1;
    iVar9 = -1;
    bVar8 = false;
    local_7b0 = -1;
    iVar34 = -1;
    local_7a8[3] = 0xffffffff;
    local_7b4 = 0xffffffff;
    break;
  case TEXTURETYPE_BUFFER:
    local_7a8[0] = 0x40;
    local_7a8[1] = 1;
    local_7a8[3] = 0x8c2a;
    local_7b0 = 1;
LAB_01482cef:
    local_7a8[2] = 1;
    bVar8 = true;
    iVar34 = 0x40;
    iVar9 = 1;
    local_7b4 = 1;
  }
  CVar2 = (this->m_format).type;
  bVar37 = (CVar2 & ~SNORM_INT16) == UNSIGNED_INT8;
  iVar11 = (**(_func_int **)((long)*pTVar33 + 0x18))(pTVar33);
  pOVar12 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&endResultTextureBuf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar11),
             pOVar12);
  iVar11 = (**(_func_int **)((long)*pTVar33 + 0x18))(pTVar33);
  pOVar12 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&returnValueTextureBuf.super_ObjectWrapper,
             (Functions *)CONCAT44(extraout_var_02,iVar11),pOVar12);
  iVar11 = (**(_func_int **)((long)*pTVar33 + 0x18))();
  pOVar12 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&endResultTexture.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_03,iVar11),
             pOVar12);
  local_53c = CVar2;
  iVar11 = (**(_func_int **)((long)*pTVar33 + 0x18))();
  pOVar12 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&returnValueTexture.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_04,iVar11),
             pOVar12);
  glLog.m_enableLog = true;
  poVar1 = (ostringstream *)(initial.m_data + 2);
  initial.m_data._0_8_ = local_6c8;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"// Created a texture (name ",0x1b);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,") to act as the target of atomic operations",0x2b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_260);
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    poVar1 = (ostringstream *)(initial.m_data + 2);
    initial.m_data._0_8_ = local_6c8;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// Created a buffer for the texture (name ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_260);
  }
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    poVar1 = (ostringstream *)(initial.m_data + 2);
    initial.m_data._0_8_ = local_6c8;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// Created a texture (name ",0x1b);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               ") to which the intermediate return values of the atomic operation are stored",0x4c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_260);
    if (this->m_imageType == TEXTURETYPE_BUFFER) {
      poVar1 = (ostringstream *)(initial.m_data + 2);
      initial.m_data._0_8_ = local_6c8;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"// Created a buffer for the texture (name ",0x2a);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_260);
    }
  }
  pTVar30 = &this->m_format;
  LayeredImage::LayeredImage(&imageData,this->m_imageType,pTVar30,iVar34,local_7b0,iVar9);
  initial.m_data[1] = -1;
  if ((ulong)this->m_operation < 7) {
    initial.m_data[1] = *(int *)(&DAT_01c5883c + (ulong)this->m_operation * 4);
  }
  initial.m_data[0] = initial.m_data[1];
  initial.m_data[3] = initial.m_data[1];
  initial.m_data[2] = initial.m_data[1];
  local_798 = this;
  local_680 = pTVar33;
  local_150 = pTVar30;
  if (bVar8) {
    z = 0;
    do {
      if (bVar8) {
        iVar9 = 0;
        do {
          if (bVar8) {
            iVar11 = 0;
            do {
              Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                        ((LayeredImage *)&imageData,iVar11,iVar9,z,&initial);
              iVar11 = iVar11 + 1;
            } while (iVar34 != iVar11);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 != local_7b0);
      }
      z = z + 1;
    } while (z != local_7b4);
  }
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  CVar7 = local_53c;
  pTVar33 = local_680;
  pBVar36 = local_798;
  iVar34 = local_7a8[3];
  glu::CallLogWrapper::glBindTexture
            (&glLog,local_7a8[3],endResultTexture.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,iVar34);
  poVar1 = (ostringstream *)(initial.m_data + 2);
  initial.m_data._0_8_ = local_6c8;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"// Filling end-result texture with initial pattern (initial value ",
             0x42);
  uVar13 = (ulong)pBVar36->m_operation;
  iVar9 = -1;
  if (uVar13 < 7) {
    iVar9 = *(int *)(&DAT_01c5883c + uVar13 * 4);
  }
  std::ostream::operator<<(poVar1,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_260);
  uploadTexture(&glLog,&imageData,endResultTextureBuf.super_ObjectWrapper.m_object);
  LayeredImage::~LayeredImage(&imageData);
  dVar32 = (deUint32)local_148;
  glu::CallLogWrapper::glBindImageTexture
            (&glLog,0,endResultTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88ba,dVar32);
  iVar9 = (**(_func_int **)((long)*pTVar33 + 0x18))(pTVar33);
  dVar10 = (**(code **)(CONCAT44(extraout_var_05,iVar9) + 0x800))();
  uVar19 = 0x7c0;
  glu::checkError(dVar10,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x7c0);
  if (pBVar36->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    glu::CallLogWrapper::glActiveTexture(&glLog,0x84c1);
    glu::CallLogWrapper::glBindTexture
              (&glLog,iVar34,returnValueTexture.super_ObjectWrapper.m_object);
    setTexParameteri(&glLog,iVar34);
    poVar1 = (ostringstream *)(initial.m_data + 2);
    initial.m_data._0_8_ = local_6c8;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// Setting storage of return-value texture",0x2a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&initial,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_260);
    TVar3 = local_798->m_imageType;
    imageData.m_type = TEXTURETYPE_1D;
    imageData.m_size.m_data[0] = (uint)(TVar3 == TEXTURETYPE_CUBE) * 4 + 1;
    imageData.m_size.m_data[1] = 1;
    initial.m_data[0] = 0;
    initial.m_data[1] = 0;
    initial.m_data._8_8_ = initial.m_data._8_8_ & 0xffffffff00000000;
    lVar14 = 0;
    do {
      initial.m_data[lVar14] = imageData.m_size.m_data[lVar14 + -1] * local_7a8[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    setTextureStorage(&glLog,TVar3,dVar32,(IVec3 *)&initial,
                      returnValueTextureBuf.super_ObjectWrapper.m_object);
    glu::CallLogWrapper::glBindImageTexture
              (&glLog,1,returnValueTexture.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,dVar32);
    iVar9 = (**(_func_int **)((long)*pTVar33 + 0x18))(pTVar33);
    dVar10 = (**(code **)(CONCAT44(extraout_var_06,iVar9) + 0x800))();
    uVar19 = 2000;
    glu::checkError(dVar10,"glBindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,2000);
  }
  uVar27 = CVar7 - SIGNED_INT8;
  paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(ulong)uVar27;
  pbVar15 = (bool *)0x1c4c531;
  pbVar35 = ::glcts::fixed_sample_locations_values + 1;
  if (2 < uVar27) {
    pbVar15 = ::glcts::fixed_sample_locations_values + 1;
  }
  pTVar33 = (TextureFormat *)
            (CONCAT71((int7)((ulong)uVar19 >> 8),CVar2 == UNSIGNED_INT32 || bVar37) & 0xffffffff);
  pbVar25 = (bool *)0x1adf404;
  if (CVar2 != UNSIGNED_INT32 && !bVar37) {
    pbVar25 = pbVar15;
  }
  initial.m_data._0_8_ = &local_2c8;
  sVar16 = strlen(pbVar25);
  std::__cxx11::string::_M_construct<char_const*>((string *)&initial,pbVar25,pbVar25 + sVar16);
  plVar17 = (long *)std::__cxx11::string::append((char *)&initial);
  colorVecTypeName._M_dataplus._M_p = (pointer)&colorVecTypeName.field_2;
  psVar20 = (size_type *)(plVar17 + 2);
  if ((size_type *)*plVar17 == psVar20) {
    colorVecTypeName.field_2._M_allocated_capacity = *psVar20;
    colorVecTypeName.field_2._8_8_ = plVar17[3];
  }
  else {
    colorVecTypeName.field_2._M_allocated_capacity = *psVar20;
    colorVecTypeName._M_dataplus._M_p = (pointer)*plVar17;
  }
  colorVecTypeName._M_string_length = plVar17[1];
  *plVar17 = (long)psVar20;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  if ((pointer *)initial.m_data._0_8_ != &local_2c8) {
    operator_delete((void *)initial.m_data._0_8_,(long)local_2c8 + 1);
  }
  iVar9 = local_7a8[0];
  if (local_798->m_imageType == TEXTURETYPE_2D) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&initial);
    std::ostream::operator<<(&initial,iVar9);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&initial);
    std::ios_base::~ios_base(local_268);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_730,0,(char *)0x0,0x1c59659);
    imageData._0_8_ = &imageData.m_format;
    pTVar30 = (TextureFormat *)(plVar17 + 2);
    if ((TextureFormat *)*plVar17 == pTVar30) {
      imageData.m_format = *pTVar30;
      imageData.m_texBuffer.m_ptr = (Texture1D *)plVar17[3];
    }
    else {
      imageData.m_format = *pTVar30;
      imageData._0_8_ = (TextureFormat *)*plVar17;
    }
    imageData.m_size.m_data[1] = (int)plVar17[1];
    imageData.m_size.m_data[2] = (int)((ulong)plVar17[1] >> 0x20);
    *plVar17 = (long)pTVar30;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&imageData);
LAB_0148374e:
    atomicCoord._M_dataplus._M_p = (pointer)&atomicCoord.field_2;
    psVar20 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar20) {
      atomicCoord.field_2._M_allocated_capacity = *psVar20;
      atomicCoord.field_2._8_8_ = plVar17[3];
    }
    else {
      atomicCoord.field_2._M_allocated_capacity = *psVar20;
      atomicCoord._M_dataplus._M_p = (pointer)*plVar17;
    }
    atomicCoord._M_string_length = plVar17[1];
    *plVar17 = (long)psVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if ((TextureFormat *)imageData._0_8_ != &imageData.m_format) {
      operator_delete((void *)imageData._0_8_,(long)imageData.m_format + 1);
    }
    TVar29 = (TextureFormat)local_728._M_string_length;
    pTVar30 = local_730;
    if (local_730 != (TextureFormat *)&local_728._M_string_length) {
LAB_014837d7:
      operator_delete(pTVar30,(long)TVar29 + 1);
    }
  }
  else {
    if (local_798->m_imageType != TEXTURETYPE_BUFFER) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&initial);
      std::ostream::operator<<(&initial,iVar9);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&initial);
      std::ios_base::~ios_base(local_268);
      plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_730,0,(char *)0x0,0x1c59665);
      imageData._0_8_ = &imageData.m_format;
      pTVar30 = (TextureFormat *)(plVar17 + 2);
      if ((TextureFormat *)*plVar17 == pTVar30) {
        imageData.m_format = *pTVar30;
        imageData.m_texBuffer.m_ptr = (Texture1D *)plVar17[3];
      }
      else {
        imageData.m_format = *pTVar30;
        imageData._0_8_ = (TextureFormat *)*plVar17;
      }
      imageData.m_size.m_data[1] = (int)plVar17[1];
      imageData.m_size.m_data[2] = (int)((ulong)plVar17[1] >> 0x20);
      *plVar17 = (long)pTVar30;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      plVar17 = (long *)std::__cxx11::string::append((char *)&imageData);
      goto LAB_0148374e;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&initial);
    std::ostream::operator<<(&initial,iVar9);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&initial);
    std::ios_base::~ios_base(local_268);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)&imageData,0,(char *)0x0,0x1c5965f);
    atomicCoord._M_dataplus._M_p = (pointer)&atomicCoord.field_2;
    psVar20 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar20) {
      atomicCoord.field_2._M_allocated_capacity = *psVar20;
      atomicCoord.field_2._8_8_ = plVar17[3];
    }
    else {
      atomicCoord.field_2._M_allocated_capacity = *psVar20;
      atomicCoord._M_dataplus._M_p = (pointer)*plVar17;
    }
    atomicCoord._M_string_length = plVar17[1];
    *plVar17 = (long)psVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    pTVar30 = (TextureFormat *)CONCAT44(imageData.m_size.m_data[0],imageData.m_type);
    TVar29 = imageData.m_format;
    if (pTVar30 != &imageData.m_format) goto LAB_014837d7;
  }
  pBVar36 = local_798;
  pcVar24 = "ivec3(gx, gy, gz)";
  if (local_798->m_imageType == TEXTURETYPE_2D) {
    pcVar24 = "ivec2(gx, gy)";
  }
  __s = "gx";
  if (local_798->m_imageType != TEXTURETYPE_BUFFER) {
    __s = pcVar24;
  }
  invocationCoord._M_dataplus._M_p = (pointer)&invocationCoord.field_2;
  sVar16 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&invocationCoord,__s,__s + sVar16);
  pbVar15 = (bool *)0x1ad61a8;
  if (uVar27 < 3) {
    pbVar15 = ::glcts::fixed_sample_locations_values + 1;
  }
  pbVar25 = (bool *)0x1aa1180;
  if ((char)pTVar33 == '\0') {
    pbVar25 = pbVar15;
  }
  AVar4 = pBVar36->m_operation;
  puVar26 = (ulong *)(ulong)AVar4;
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"gx","");
  local_618 = &local_608;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"gy","");
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"gz","");
  if (AVar4 < ATOMIC_OPERATION_EXCHANGE) {
    std::operator+(&local_6a0,"(",&local_5d8);
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_6a0);
    local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
    puVar26 = puVar18 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar18 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar26) {
      local_678.field_2._M_allocated_capacity = *puVar26;
      local_678.field_2._8_8_ = puVar18[3];
    }
    else {
      local_678.field_2._M_allocated_capacity = *puVar26;
      local_678._M_dataplus._M_p = (pointer)*puVar18;
    }
    local_678._M_string_length = puVar18[1];
    *puVar18 = puVar26;
    puVar18[1] = 0;
    *(undefined1 *)(puVar18 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_678,(ulong)local_5d8._M_dataplus._M_p);
    local_750 = &local_740;
    puVar26 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar26) {
      local_740 = *puVar26;
      lStack_738 = plVar17[3];
    }
    else {
      local_740 = *puVar26;
      local_750 = (ulong *)*plVar17;
    }
    local_748 = plVar17[1];
    *plVar17 = (long)puVar26;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_750);
    local_6e8 = &local_6d8;
    plVar17 = puVar18 + 2;
    if ((long *)*puVar18 == plVar17) {
      local_6d8 = *plVar17;
      lStack_6d0 = puVar18[3];
    }
    else {
      local_6d8 = *plVar17;
      local_6e8 = (long *)*puVar18;
    }
    local_6e0 = puVar18[1];
    *puVar18 = plVar17;
    puVar18[1] = 0;
    *(undefined1 *)(puVar18 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_6e8,(ulong)local_618);
    psVar20 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar20) {
      glslVersionDeclaration.field_2._M_allocated_capacity = *psVar20;
      glslVersionDeclaration.field_2._8_8_ = plVar17[3];
      glslVersionDeclaration._M_dataplus._M_p = (pointer)&glslVersionDeclaration.field_2;
    }
    else {
      glslVersionDeclaration.field_2._M_allocated_capacity = *psVar20;
      glslVersionDeclaration._M_dataplus._M_p = (pointer)*plVar17;
    }
    glslVersionDeclaration._M_string_length = plVar17[1];
    *plVar17 = (long)psVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&glslVersionDeclaration);
    psVar20 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar20) {
      shaderImageTypeStr.field_2._M_allocated_capacity = *psVar20;
      shaderImageTypeStr.field_2._8_8_ = plVar17[3];
      shaderImageTypeStr._M_dataplus._M_p = (pointer)&shaderImageTypeStr.field_2;
    }
    else {
      shaderImageTypeStr.field_2._M_allocated_capacity = *psVar20;
      shaderImageTypeStr._M_dataplus._M_p = (pointer)*plVar17;
    }
    shaderImageTypeStr._M_string_length = plVar17[1];
    *plVar17 = (long)psVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append((char *)&shaderImageTypeStr,(ulong)local_618);
    psVar20 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar20) {
      shaderImageFormatStr.field_2._M_allocated_capacity = *psVar20;
      shaderImageFormatStr.field_2._8_8_ = plVar17[3];
      shaderImageFormatStr._M_dataplus._M_p = (pointer)&shaderImageFormatStr.field_2;
    }
    else {
      shaderImageFormatStr.field_2._M_allocated_capacity = *psVar20;
      shaderImageFormatStr._M_dataplus._M_p = (pointer)*plVar17;
    }
    shaderImageFormatStr._M_string_length = plVar17[1];
    *plVar17 = (long)psVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&shaderImageFormatStr);
    psVar20 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar20) {
      atomicInvocation.field_2._M_allocated_capacity = *psVar20;
      atomicInvocation.field_2._8_8_ = plVar17[3];
      atomicInvocation._M_dataplus._M_p = (pointer)&atomicInvocation.field_2;
    }
    else {
      atomicInvocation.field_2._M_allocated_capacity = *psVar20;
      atomicInvocation._M_dataplus._M_p = (pointer)*plVar17;
    }
    atomicInvocation._M_string_length = plVar17[1];
    *plVar17 = (long)psVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append
                                ((char *)&atomicInvocation,(ulong)local_638._M_dataplus._M_p);
    pTVar33 = (TextureFormat *)(plVar17 + 2);
    if ((TextureFormat *)*plVar17 == pTVar33) {
      local_728._M_string_length = *(size_type *)pTVar33;
      local_728.field_2._M_allocated_capacity = plVar17[3];
      local_730 = (TextureFormat *)&local_728._M_string_length;
    }
    else {
      local_728._M_string_length = *(size_type *)pTVar33;
      local_730 = (TextureFormat *)*plVar17;
    }
    local_728._M_dataplus._M_p = (pointer)plVar17[1];
    *plVar17 = (long)pTVar33;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_730);
    pTVar33 = (TextureFormat *)(plVar17 + 2);
    if ((TextureFormat *)*plVar17 == pTVar33) {
      imageData.m_format = *pTVar33;
      imageData.m_texBuffer.m_ptr = (Texture1D *)plVar17[3];
      imageData._0_8_ = &imageData.m_format;
    }
    else {
      imageData.m_format = *pTVar33;
      imageData._0_8_ = (TextureFormat *)*plVar17;
    }
    imageData.m_size.m_data[1] = (int)plVar17[1];
    imageData.m_size.m_data[2] = (int)((ulong)plVar17[1] >> 0x20);
    *plVar17 = (long)pTVar33;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append
                                ((char *)&imageData,(ulong)local_638._M_dataplus._M_p);
    initial.m_data._0_8_ = &local_2c8;
    plVar21 = plVar17 + 2;
    if ((long *)*plVar17 == plVar21) {
      local_2c8 = (pointer)*plVar21;
      ppSStack_2c0 = (pointer)plVar17[3];
    }
    else {
      local_2c8 = (pointer)*plVar21;
      initial.m_data._0_8_ = (long *)*plVar17;
    }
    initial.m_data._8_8_ = plVar17[1];
    *plVar17 = (long)plVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&initial);
    local_658 = &local_648;
    plVar21 = plVar17 + 2;
    if ((long *)*plVar17 == plVar21) {
      local_648 = *plVar21;
      lStack_640 = plVar17[3];
    }
    else {
      local_648 = *plVar21;
      local_658 = (long *)*plVar17;
    }
    local_650 = plVar17[1];
    *plVar17 = (long)plVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if ((pointer *)initial.m_data._0_8_ != &local_2c8) {
      operator_delete((void *)initial.m_data._0_8_,(long)local_2c8 + 1);
    }
    if ((TextureFormat *)imageData._0_8_ != &imageData.m_format) {
      operator_delete((void *)imageData._0_8_,(long)imageData.m_format + 1);
    }
    if (local_730 != (TextureFormat *)&local_728._M_string_length) {
      operator_delete(local_730,local_728._M_string_length + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)atomicInvocation._M_dataplus._M_p != &atomicInvocation.field_2) {
      operator_delete(atomicInvocation._M_dataplus._M_p,
                      atomicInvocation.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
      operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                      shaderImageFormatStr.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
      operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                      shaderImageTypeStr.field_2._M_allocated_capacity + 1);
    }
    pTVar33 = local_680;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
      operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                      glslVersionDeclaration.field_2._M_allocated_capacity + 1);
    }
    if (local_6e8 != &local_6d8) {
      operator_delete(local_6e8,local_6d8 + 1);
    }
    if (local_750 != &local_740) {
      operator_delete(local_750,local_740 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p != &local_678.field_2) {
      operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
LAB_01483eba:
      operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (AVar4 != ATOMIC_OPERATION_EXCHANGE) goto LAB_01485d66;
    iVar9 = local_7a8[0];
    iVar34 = local_7a8[1];
    std::operator+(&local_678,"((",&local_638);
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_678);
    puVar26 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar26) {
      local_740 = *puVar26;
      lStack_738 = plVar17[3];
      local_750 = &local_740;
    }
    else {
      local_740 = *puVar26;
      local_750 = (ulong *)*plVar17;
    }
    local_748 = plVar17[1];
    *plVar17 = (long)puVar26;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&initial);
    std::ostream::operator<<(&initial,iVar9 * 5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&initial);
    std::ios_base::~ios_base(local_268);
    uVar13 = 0xf;
    if (local_750 != &local_740) {
      uVar13 = local_740;
    }
    if (uVar13 < local_6a0._M_string_length + local_748) {
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
        uVar19 = local_6a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_6a0._M_string_length + local_748) goto LAB_01485813;
      puVar18 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_6a0,0,(char *)0x0,(ulong)local_750);
    }
    else {
LAB_01485813:
      puVar18 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_750,(ulong)local_6a0._M_dataplus._M_p);
    }
    local_6e8 = &local_6d8;
    plVar17 = puVar18 + 2;
    if ((long *)*puVar18 == plVar17) {
      local_6d8 = *plVar17;
      lStack_6d0 = puVar18[3];
    }
    else {
      local_6d8 = *plVar17;
      local_6e8 = (long *)*puVar18;
    }
    local_6e0 = puVar18[1];
    *puVar18 = plVar17;
    puVar18[1] = 0;
    *(undefined1 *)plVar17 = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_6e8);
    psVar20 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar20) {
      glslVersionDeclaration.field_2._M_allocated_capacity = *psVar20;
      glslVersionDeclaration.field_2._8_8_ = plVar17[3];
      glslVersionDeclaration._M_dataplus._M_p = (pointer)&glslVersionDeclaration.field_2;
    }
    else {
      glslVersionDeclaration.field_2._M_allocated_capacity = *psVar20;
      glslVersionDeclaration._M_dataplus._M_p = (pointer)*plVar17;
    }
    glslVersionDeclaration._M_string_length = plVar17[1];
    *plVar17 = (long)psVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append
                                ((char *)&glslVersionDeclaration,(ulong)local_5d8._M_dataplus._M_p);
    psVar20 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar20) {
      shaderImageTypeStr.field_2._M_allocated_capacity = *psVar20;
      shaderImageTypeStr.field_2._8_8_ = plVar17[3];
      shaderImageTypeStr._M_dataplus._M_p = (pointer)&shaderImageTypeStr.field_2;
    }
    else {
      shaderImageTypeStr.field_2._M_allocated_capacity = *psVar20;
      shaderImageTypeStr._M_dataplus._M_p = (pointer)*plVar17;
    }
    shaderImageTypeStr._M_string_length = plVar17[1];
    *plVar17 = (long)psVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&shaderImageTypeStr);
    paVar28 = &shaderImageFormatStr.field_2;
    psVar20 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar20) {
      shaderImageFormatStr.field_2._M_allocated_capacity = *psVar20;
      shaderImageFormatStr.field_2._8_8_ = plVar17[3];
      shaderImageFormatStr._M_dataplus._M_p = (pointer)paVar28;
    }
    else {
      shaderImageFormatStr.field_2._M_allocated_capacity = *psVar20;
      shaderImageFormatStr._M_dataplus._M_p = (pointer)*plVar17;
    }
    shaderImageFormatStr._M_string_length = plVar17[1];
    *plVar17 = (long)psVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&initial);
    std::ostream::operator<<(&initial,iVar34);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&initial);
    std::ios_base::~ios_base(local_268);
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shaderImageFormatStr._M_dataplus._M_p != paVar28) {
      uVar19 = shaderImageFormatStr.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < local_5f0 + shaderImageFormatStr._M_string_length) {
      uVar13 = 0xf;
      if (local_5f8 != &local_5e8) {
        uVar13 = local_5e8;
      }
      if (uVar13 < local_5f0 + shaderImageFormatStr._M_string_length) goto LAB_01485a48;
      puVar18 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_5f8,0,(char *)0x0,
                           (ulong)shaderImageFormatStr._M_dataplus._M_p);
    }
    else {
LAB_01485a48:
      puVar18 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&shaderImageFormatStr,(ulong)local_5f8);
    }
    atomicInvocation._M_dataplus._M_p = (pointer)&atomicInvocation.field_2;
    psVar20 = puVar18 + 2;
    if ((size_type *)*puVar18 == psVar20) {
      atomicInvocation.field_2._M_allocated_capacity = *psVar20;
      atomicInvocation.field_2._8_8_ = puVar18[3];
    }
    else {
      atomicInvocation.field_2._M_allocated_capacity = *psVar20;
      atomicInvocation._M_dataplus._M_p = (pointer)*puVar18;
    }
    atomicInvocation._M_string_length = puVar18[1];
    *puVar18 = psVar20;
    puVar18[1] = 0;
    *(char *)psVar20 = '\0';
    plVar17 = (long *)std::__cxx11::string::append((char *)&atomicInvocation);
    pTVar33 = (TextureFormat *)(plVar17 + 2);
    if ((TextureFormat *)*plVar17 == pTVar33) {
      local_728._M_string_length = *(size_type *)pTVar33;
      local_728.field_2._M_allocated_capacity = plVar17[3];
      local_730 = (TextureFormat *)&local_728._M_string_length;
    }
    else {
      local_728._M_string_length = *(size_type *)pTVar33;
      local_730 = (TextureFormat *)*plVar17;
    }
    local_728._M_dataplus._M_p = (pointer)plVar17[1];
    *plVar17 = (long)pTVar33;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append((char *)&local_730,(ulong)local_618);
    pTVar33 = (TextureFormat *)(plVar17 + 2);
    if ((TextureFormat *)*plVar17 == pTVar33) {
      imageData.m_format = *pTVar33;
      imageData.m_texBuffer.m_ptr = (Texture1D *)plVar17[3];
      imageData._0_8_ = &imageData.m_format;
    }
    else {
      imageData.m_format = *pTVar33;
      imageData._0_8_ = (TextureFormat *)*plVar17;
    }
    imageData.m_size.m_data[1] = (int)plVar17[1];
    imageData.m_size.m_data[2] = (int)((ulong)plVar17[1] >> 0x20);
    *plVar17 = (long)pTVar33;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&imageData);
    local_658 = &local_648;
    plVar17 = puVar18 + 2;
    if ((long *)*puVar18 == plVar17) {
      local_648 = *plVar17;
      lStack_640 = puVar18[3];
    }
    else {
      local_648 = *plVar17;
      local_658 = (long *)*puVar18;
    }
    local_650 = puVar18[1];
    *puVar18 = plVar17;
    puVar18[1] = 0;
    *(undefined1 *)(puVar18 + 2) = 0;
    if ((TextureFormat *)imageData._0_8_ != &imageData.m_format) {
      operator_delete((void *)imageData._0_8_,(long)imageData.m_format + 1);
    }
    if (local_730 != (TextureFormat *)&local_728._M_string_length) {
      operator_delete(local_730,local_728._M_string_length + 1);
    }
    pTVar33 = local_680;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)atomicInvocation._M_dataplus._M_p != &atomicInvocation.field_2) {
      operator_delete(atomicInvocation._M_dataplus._M_p,
                      atomicInvocation.field_2._M_allocated_capacity + 1);
    }
    if (local_5f8 != &local_5e8) {
      operator_delete(local_5f8,local_5e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shaderImageFormatStr._M_dataplus._M_p != paVar28) {
      operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                      shaderImageFormatStr.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
      operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                      shaderImageTypeStr.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
      operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                      glslVersionDeclaration.field_2._M_allocated_capacity + 1);
    }
    if (local_6e8 != &local_6d8) {
      operator_delete(local_6e8,local_6d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
      operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
    }
    if (local_750 != &local_740) {
      operator_delete(local_750,local_740 + 1);
    }
    local_6a0.field_2._M_allocated_capacity = local_678.field_2._M_allocated_capacity;
    local_6a0._M_dataplus._M_p = local_678._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p != &local_678.field_2) goto LAB_01483eba;
  }
  sVar16 = strlen(pbVar25);
  isSampler = (undefined1)sVar16;
  plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_658,0,(char *)0x0,(ulong)pbVar25);
  atomicArgExpr._M_dataplus._M_p = (pointer)&atomicArgExpr.field_2;
  psVar20 = (size_type *)(plVar17 + 2);
  if ((size_type *)*plVar17 == psVar20) {
    atomicArgExpr.field_2._M_allocated_capacity = *psVar20;
    atomicArgExpr.field_2._8_8_ = plVar17[3];
  }
  else {
    atomicArgExpr.field_2._M_allocated_capacity = *psVar20;
    atomicArgExpr._M_dataplus._M_p = (pointer)*plVar17;
  }
  atomicArgExpr._M_string_length = plVar17[1];
  *plVar17 = (long)psVar20;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  if (local_658 != &local_648) {
    operator_delete(local_658,local_648 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  if (local_618 != &local_608) {
    operator_delete(local_618,local_608 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  glslVersionDeclaration._M_string_length = 0;
  glslVersionDeclaration.field_2._M_allocated_capacity =
       glslVersionDeclaration.field_2._M_allocated_capacity & 0xffffffffffffff00;
  glslVersionDeclaration._M_dataplus._M_p = (pointer)&glslVersionDeclaration.field_2;
  plVar17 = (long *)std::__cxx11::string::append((char *)&glslVersionDeclaration);
  shaderImageTypeStr._M_dataplus._M_p = (pointer)&shaderImageTypeStr.field_2;
  psVar20 = (size_type *)(plVar17 + 2);
  if ((size_type *)*plVar17 == psVar20) {
    shaderImageTypeStr.field_2._M_allocated_capacity = *psVar20;
    shaderImageTypeStr.field_2._8_8_ = plVar17[3];
  }
  else {
    shaderImageTypeStr.field_2._M_allocated_capacity = *psVar20;
    shaderImageTypeStr._M_dataplus._M_p = (pointer)*plVar17;
  }
  shaderImageTypeStr._M_string_length = plVar17[1];
  *plVar17 = (long)psVar20;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&shaderImageTypeStr);
  shaderImageFormatStr._M_dataplus._M_p = (pointer)&shaderImageFormatStr.field_2;
  psVar20 = (size_type *)(plVar17 + 2);
  if ((size_type *)*plVar17 == psVar20) {
    shaderImageFormatStr.field_2._M_allocated_capacity = *psVar20;
    shaderImageFormatStr.field_2._8_8_ = plVar17[3];
  }
  else {
    shaderImageFormatStr.field_2._M_allocated_capacity = *psVar20;
    shaderImageFormatStr._M_dataplus._M_p = (pointer)*plVar17;
  }
  shaderImageFormatStr._M_string_length = plVar17[1];
  *plVar17 = (long)psVar20;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::_M_append
                              ((char *)&shaderImageFormatStr,(ulong)atomicCoord._M_dataplus._M_p);
  pTVar30 = (TextureFormat *)(plVar17 + 2);
  if ((TextureFormat *)*plVar17 == pTVar30) {
    local_728._M_string_length = *(size_type *)pTVar30;
    local_728.field_2._M_allocated_capacity = plVar17[3];
    local_730 = (TextureFormat *)&local_728._M_string_length;
  }
  else {
    local_728._M_string_length = *(size_type *)pTVar30;
    local_730 = (TextureFormat *)*plVar17;
  }
  local_728._M_dataplus._M_p = (pointer)plVar17[1];
  *plVar17 = (long)pTVar30;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_730);
  pTVar30 = (TextureFormat *)(plVar17 + 2);
  if ((TextureFormat *)*plVar17 == pTVar30) {
    imageData.m_format = *pTVar30;
    imageData.m_texBuffer.m_ptr = (Texture1D *)plVar17[3];
    imageData._0_8_ = &imageData.m_format;
  }
  else {
    imageData.m_format = *pTVar30;
    imageData._0_8_ = (TextureFormat *)*plVar17;
  }
  imageData.m_size.m_data[1] = (int)plVar17[1];
  imageData.m_size.m_data[2] = (int)((ulong)plVar17[1] >> 0x20);
  *plVar17 = (long)pTVar30;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::_M_append
                              ((char *)&imageData,(ulong)atomicArgExpr._M_dataplus._M_p);
  initial.m_data._0_8_ = &local_2c8;
  plVar21 = plVar17 + 2;
  if ((long *)*plVar17 == plVar21) {
    local_2c8 = (pointer)*plVar21;
    ppSStack_2c0 = (pointer)plVar17[3];
  }
  else {
    local_2c8 = (pointer)*plVar21;
    initial.m_data._0_8_ = (long *)*plVar17;
  }
  initial.m_data._8_8_ = plVar17[1];
  *plVar17 = (long)plVar21;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&initial);
  atomicInvocation._M_dataplus._M_p = (pointer)&atomicInvocation.field_2;
  psVar20 = (size_type *)(plVar17 + 2);
  if ((size_type *)*plVar17 == psVar20) {
    atomicInvocation.field_2._M_allocated_capacity = *psVar20;
    atomicInvocation.field_2._8_8_ = plVar17[3];
  }
  else {
    atomicInvocation.field_2._M_allocated_capacity = *psVar20;
    atomicInvocation._M_dataplus._M_p = (pointer)*plVar17;
  }
  atomicInvocation._M_string_length = plVar17[1];
  *plVar17 = (long)psVar20;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  if ((pointer *)initial.m_data._0_8_ != &local_2c8) {
    operator_delete((void *)initial.m_data._0_8_,(long)local_2c8 + 1);
  }
  if ((TextureFormat *)imageData._0_8_ != &imageData.m_format) {
    operator_delete((void *)imageData._0_8_,(long)imageData.m_format + 1);
  }
  pBVar36 = local_798;
  if (local_730 != (TextureFormat *)&local_728._M_string_length) {
    operator_delete(local_730,local_728._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
    operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                    shaderImageFormatStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
    operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                    shaderImageTypeStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  getShaderImageFormatQualifier_abi_cxx11_
            (&shaderImageFormatStr,(Functional *)(ulong)(pBVar36->m_format).order,
             (TextureFormat *)(ulong)(pBVar36->m_format).type);
  getShaderSamplerOrImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)(pBVar36->m_format).type,pBVar36->m_imageType,
             TEXTURETYPE_2D,(bool)isSampler);
  type.super_ApiType.m_bits = (ApiType)(**(code **)((long)*pTVar33 + 0x10))(pTVar33);
  version = glu::getContextTypeGLSLVersion(type);
  pcVar24 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar24,(allocator<char> *)&initial);
  memset(&imageData,0,0xac);
  local_3c8._0_9_ = SUB169((undefined1  [16])0x0,0);
  local_3c8._M_finish._1_7_ = 0;
  stack0xfffffffffffffc48 = SUB169((undefined1  [16])0x0,7);
  local_518 = local_508;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_518,glslVersionDeclaration._M_dataplus._M_p,
             glslVersionDeclaration._M_dataplus._M_p + glslVersionDeclaration._M_string_length);
  std::__cxx11::string::append((char *)&local_518);
  imageAtomicExtensionShaderRequires_abi_cxx11_(&local_388,(Functional *)pTVar33,renderContext_00);
  uVar13 = 0xf;
  if (local_518 != local_508) {
    uVar13 = local_508[0];
  }
  if (uVar13 < local_388._M_string_length + local_510) {
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      uVar19 = local_388.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < local_388._M_string_length + local_510) goto LAB_0148442f;
    puVar18 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_518);
  }
  else {
LAB_0148442f:
    puVar18 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_518,(ulong)local_388._M_dataplus._M_p);
  }
  local_560 = &local_550;
  renderContext = (RenderContext *)(puVar18 + 2);
  if ((RenderContext *)*puVar18 == renderContext) {
    local_550._vptr_RenderContext = renderContext->_vptr_RenderContext;
    uStack_548 = puVar18[3];
  }
  else {
    local_550._vptr_RenderContext = renderContext->_vptr_RenderContext;
    local_560 = (RenderContext *)*puVar18;
  }
  local_558 = puVar18[1];
  *puVar18 = renderContext;
  puVar18[1] = 0;
  *(undefined1 *)&renderContext->_vptr_RenderContext = 0;
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_3a8,(Functional *)(ulong)pBVar36->m_imageType,(TextureType)pTVar33,renderContext
            );
  RVar31._vptr_RenderContext = (_func_int **)0xf;
  if (local_560 != &local_550) {
    RVar31._vptr_RenderContext = local_550._vptr_RenderContext;
  }
  if (RVar31._vptr_RenderContext < (_func_int **)(local_3a8._M_string_length + local_558)) {
    uVar19 = (_func_int **)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      uVar19 = local_3a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < (_func_int **)(local_3a8._M_string_length + local_558)) goto LAB_01484515;
    puVar18 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3a8,0,(char *)0x0,(ulong)local_560);
  }
  else {
LAB_01484515:
    puVar18 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_560,(ulong)local_3a8._M_dataplus._M_p);
  }
  local_4d8 = &local_4c8;
  plVar17 = puVar18 + 2;
  if ((long *)*puVar18 == plVar17) {
    local_4c8 = *plVar17;
    uStack_4c0 = puVar18[3];
  }
  else {
    local_4c8 = *plVar17;
    local_4d8 = (long *)*puVar18;
  }
  local_4d0 = puVar18[1];
  *puVar18 = plVar17;
  puVar18[1] = 0;
  *(undefined1 *)plVar17 = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_4d8);
  local_368 = (pointer)local_358;
  pPVar22 = (pointer)(plVar17 + 2);
  if ((pointer)*plVar17 == pPVar22) {
    local_358._0_8_ = (pPVar22->super_ConstPixelBufferAccess).m_format;
    local_358._8_8_ = plVar17[3];
  }
  else {
    local_358._0_8_ = (pPVar22->super_ConstPixelBufferAccess).m_format;
    local_368 = (pointer)*plVar17;
  }
  local_360 = plVar17[1];
  *plVar17 = (long)pPVar22;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_368,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_348 = (pointer)local_338;
  pPVar22 = (pointer)(plVar17 + 2);
  if ((pointer)*plVar17 == pPVar22) {
    local_338._0_8_ = (pPVar22->super_ConstPixelBufferAccess).m_format;
    local_338._8_8_ = plVar17[3];
  }
  else {
    local_338._0_8_ = (pPVar22->super_ConstPixelBufferAccess).m_format;
    local_348 = (pointer)*plVar17;
  }
  local_340 = plVar17[1];
  *plVar17 = (long)pPVar22;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_348);
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  psVar20 = (size_type *)(plVar17 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar17 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar20) {
    local_638.field_2._M_allocated_capacity = *psVar20;
    local_638.field_2._8_8_ = plVar17[3];
  }
  else {
    local_638.field_2._M_allocated_capacity = *psVar20;
    local_638._M_dataplus._M_p = (pointer)*plVar17;
  }
  local_638._M_string_length = plVar17[1];
  *plVar17 = (long)psVar20;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_638,(ulong)shaderImageFormatStr._M_dataplus._M_p);
  plVar21 = plVar17 + 2;
  if ((long *)*plVar17 == plVar21) {
    local_608 = *plVar21;
    lStack_600 = plVar17[3];
    local_618 = &local_608;
  }
  else {
    local_608 = *plVar21;
    local_618 = (long *)*plVar17;
  }
  local_610 = plVar17[1];
  *plVar17 = (long)plVar21;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_618);
  psVar20 = (size_type *)(plVar17 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar17 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar20) {
    local_5d8.field_2._M_allocated_capacity = *psVar20;
    local_5d8.field_2._8_8_ = plVar17[3];
    local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  }
  else {
    local_5d8.field_2._M_allocated_capacity = *psVar20;
    local_5d8._M_dataplus._M_p = (pointer)*plVar17;
  }
  local_5d8._M_string_length = plVar17[1];
  *plVar17 = (long)psVar20;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_5d8,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_658 = &local_648;
  plVar21 = plVar17 + 2;
  if ((long *)*plVar17 == plVar21) {
    local_648 = *plVar21;
    lStack_640 = plVar17[3];
  }
  else {
    local_648 = *plVar21;
    local_658 = (long *)*plVar17;
  }
  local_650 = plVar17[1];
  *plVar17 = (long)plVar21;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_658);
  puVar26 = &local_5e8;
  puVar23 = (ulong *)(plVar17 + 2);
  if ((ulong *)*plVar17 == puVar23) {
    local_5e8 = *puVar23;
    lStack_5e0 = plVar17[3];
    local_5f8 = puVar26;
  }
  else {
    local_5e8 = *puVar23;
    local_5f8 = (ulong *)*plVar17;
  }
  local_5f0 = plVar17[1];
  *plVar17 = (long)puVar23;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  AVar5 = pBVar36->m_caseType;
  pbVar35 = (bool *)(ulong)AVar5;
  if (AVar5 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_50,"layout (",&shaderImageFormatStr);
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_e0 = &local_d0;
    plVar21 = plVar17 + 2;
    if ((long *)*plVar17 == plVar21) {
      local_d0 = *plVar21;
      lStack_c8 = plVar17[3];
    }
    else {
      local_d0 = *plVar21;
      local_e0 = (long *)*plVar17;
    }
    local_d8 = plVar17[1];
    *plVar17 = (long)plVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_e0,(ulong)shaderImageTypeStr._M_dataplus._M_p);
    local_c0 = &local_b0;
    plVar21 = plVar17 + 2;
    if ((long *)*plVar17 == plVar21) {
      local_b0 = *plVar21;
      lStack_a8 = plVar17[3];
    }
    else {
      local_b0 = *plVar21;
      local_c0 = (long *)*plVar17;
    }
    local_b8 = plVar17[1];
    *plVar17 = (long)plVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_c0);
    local_538 = &local_528;
    puVar23 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar23) {
      local_528 = *puVar23;
      lStack_520 = plVar17[3];
    }
    else {
      local_528 = *puVar23;
      local_538 = (ulong *)*plVar17;
    }
    local_530 = plVar17[1];
    *plVar17 = (long)puVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
  }
  else {
    local_538 = &local_528;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,0x1af8059);
  }
  uVar13 = 0xf;
  if (local_5f8 != puVar26) {
    uVar13 = local_5e8;
  }
  if (uVar13 < (ulong)(local_530 + local_5f0)) {
    uVar13 = 0xf;
    if (local_538 != &local_528) {
      uVar13 = local_528;
    }
    if (uVar13 < (ulong)(local_530 + local_5f0)) goto LAB_01484a27;
    puVar18 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_538,0,(char *)0x0,(ulong)local_5f8);
  }
  else {
LAB_01484a27:
    puVar18 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5f8,(ulong)local_538);
  }
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  puVar23 = puVar18 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar18 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar23) {
    local_6a0.field_2._M_allocated_capacity = *puVar23;
    local_6a0.field_2._8_8_ = puVar18[3];
  }
  else {
    local_6a0.field_2._M_allocated_capacity = *puVar23;
    local_6a0._M_dataplus._M_p = (pointer)*puVar18;
  }
  local_6a0._M_string_length = puVar18[1];
  *puVar18 = puVar23;
  puVar18[1] = 0;
  *(undefined1 *)puVar23 = 0;
  puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_6a0);
  paVar28 = &local_678.field_2;
  puVar23 = puVar18 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar18 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar23) {
    local_678.field_2._M_allocated_capacity = *puVar23;
    local_678.field_2._8_8_ = puVar18[3];
    local_678._M_dataplus._M_p = (pointer)paVar28;
  }
  else {
    local_678.field_2._M_allocated_capacity = *puVar23;
    local_678._M_dataplus._M_p = (pointer)*puVar18;
  }
  local_678._M_string_length = puVar18[1];
  *puVar18 = puVar23;
  puVar18[1] = 0;
  *(undefined1 *)(puVar18 + 2) = 0;
  AVar6 = local_798->m_caseType;
  pBVar36 = (BinaryAtomicOperationCase *)(ulong)AVar6;
  if (AVar6 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_70,"\timageStore(u_returnValues, ",&invocationCoord);
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_140 = &local_130;
    plVar21 = plVar17 + 2;
    if ((long *)*plVar17 == plVar21) {
      local_130 = *plVar21;
      lStack_128 = plVar17[3];
    }
    else {
      local_130 = *plVar21;
      local_140 = (long *)*plVar17;
    }
    local_138 = plVar17[1];
    *plVar17 = (long)plVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_140,(ulong)colorVecTypeName._M_dataplus._M_p);
    local_120 = &local_110;
    plVar21 = plVar17 + 2;
    if ((long *)*plVar17 == plVar21) {
      local_110 = *plVar21;
      lStack_108 = plVar17[3];
    }
    else {
      local_110 = *plVar21;
      local_120 = (long *)*plVar17;
    }
    local_118 = plVar17[1];
    *plVar17 = (long)plVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_100 = &local_f0;
    plVar21 = plVar17 + 2;
    if ((long *)*plVar17 == plVar21) {
      local_f0 = *plVar21;
      lStack_e8 = plVar17[3];
    }
    else {
      local_f0 = *plVar21;
      local_100 = (long *)*plVar17;
    }
    local_f8 = plVar17[1];
    *plVar17 = (long)plVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_100,(ulong)atomicInvocation._M_dataplus._M_p);
    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    psVar20 = (size_type *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar20) {
      local_4f8.field_2._M_allocated_capacity = *psVar20;
      local_4f8.field_2._8_8_ = plVar17[3];
    }
    else {
      local_4f8.field_2._M_allocated_capacity = *psVar20;
      local_4f8._M_dataplus._M_p = (pointer)*plVar17;
    }
    local_4f8._M_string_length = plVar17[1];
    *plVar17 = (long)psVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_4f8);
  }
  else {
    if (AVar6 != ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      local_5a0 = &local_590;
      std::__throw_logic_error("basic_string::_M_construct null not valid");
LAB_01485d66:
      local_658 = &local_648;
      uVar19 = std::__throw_logic_error("basic_string::_M_construct null not valid");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)imageData._0_8_ != paVar28) {
        operator_delete((void *)imageData._0_8_,(long)imageData.m_format + 1);
      }
      if (local_730 != pTVar33) {
        operator_delete(local_730,local_728._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)atomicInvocation._M_dataplus._M_p != &atomicInvocation.field_2) {
        operator_delete(atomicInvocation._M_dataplus._M_p,
                        atomicInvocation.field_2._M_allocated_capacity + 1);
      }
      if (local_5f8 != &local_5e8) {
        operator_delete(local_5f8,local_5e8 + 1);
      }
      if ((BinaryAtomicOperationCase *)shaderImageFormatStr._M_dataplus._M_p != pBVar36) {
        operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                        shaderImageFormatStr.field_2._M_allocated_capacity + 1);
      }
      if ((ulong *)shaderImageTypeStr._M_dataplus._M_p != puVar26) {
        operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                        shaderImageTypeStr.field_2._M_allocated_capacity + 1);
      }
      if ((bool *)glslVersionDeclaration._M_dataplus._M_p != pbVar35) {
        operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                        glslVersionDeclaration.field_2._M_allocated_capacity + 1);
      }
      if (local_6e8 != &local_6d8) {
        operator_delete(local_6e8,local_6d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
        operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
      }
      if (local_750 != &local_740) {
        operator_delete(local_750,local_740 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678._M_dataplus._M_p != &local_678.field_2) {
        operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._M_dataplus._M_p != &local_638.field_2) {
        operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
      }
      if (local_618 != &local_608) {
        operator_delete(local_618,local_608 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
        operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)invocationCoord._M_dataplus._M_p != &invocationCoord.field_2) {
        operator_delete(invocationCoord._M_dataplus._M_p,
                        invocationCoord.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)atomicCoord._M_dataplus._M_p != &atomicCoord.field_2) {
        operator_delete(atomicCoord._M_dataplus._M_p,atomicCoord.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)colorVecTypeName._M_dataplus._M_p != &colorVecTypeName.field_2) {
        operator_delete(colorVecTypeName._M_dataplus._M_p,
                        colorVecTypeName.field_2._M_allocated_capacity + 1);
      }
      glu::ObjectWrapper::~ObjectWrapper(&returnValueTexture.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&endResultTexture.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&returnValueTextureBuf.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&endResultTextureBuf.super_ObjectWrapper);
      glu::CallLogWrapper::~CallLogWrapper(&glLog);
      _Unwind_Resume(uVar19);
    }
    std::operator+(&local_4f8,"\t",&atomicInvocation);
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_4f8);
  }
  local_5a0 = &local_590;
  puVar26 = puVar18 + 2;
  if ((ulong *)*puVar18 == puVar26) {
    local_590 = *puVar26;
    uStack_588 = puVar18[3];
  }
  else {
    local_590 = *puVar26;
    local_5a0 = (ulong *)*puVar18;
  }
  local_598 = puVar18[1];
  *puVar18 = puVar26;
  puVar18[1] = 0;
  *(undefined1 *)puVar26 = 0;
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != paVar28) {
    uVar19 = local_678.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_598 + local_678._M_string_length) {
    uVar13 = 0xf;
    if (local_5a0 != &local_590) {
      uVar13 = local_590;
    }
    if (uVar13 < local_598 + local_678._M_string_length) goto LAB_01484dd1;
    puVar18 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_5a0,0,(char *)0x0,(ulong)local_678._M_dataplus._M_p);
  }
  else {
LAB_01484dd1:
    puVar18 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_678,(ulong)local_5a0);
  }
  local_750 = &local_740;
  puVar26 = puVar18 + 2;
  if ((ulong *)*puVar18 == puVar26) {
    local_740 = *puVar26;
    lStack_738 = puVar18[3];
  }
  else {
    local_740 = *puVar26;
    local_750 = (ulong *)*puVar18;
  }
  local_748 = puVar18[1];
  *puVar18 = puVar26;
  puVar18[1] = 0;
  *(undefined1 *)puVar26 = 0;
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_750);
  plVar21 = plVar17 + 2;
  if ((long *)*plVar17 == plVar21) {
    local_6d8 = *plVar21;
    lStack_6d0 = plVar17[3];
    local_6e8 = &local_6d8;
  }
  else {
    local_6d8 = *plVar21;
    local_6e8 = (long *)*plVar17;
  }
  local_6e0 = plVar17[1];
  *plVar17 = (long)plVar21;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  local_730 = (TextureFormat *)CONCAT44(local_730._4_4_,5);
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_728,local_6e8,local_6e0 + (long)local_6e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((&imageData.m_size)[((ulong)local_730 & 0xffffffff) * 2 + -1].m_data + 2),
              &local_728);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)&initial,(RenderContext *)local_680,(ProgramSources *)&imageData);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
  }
  pTVar33 = local_680;
  if (local_6e8 != &local_6d8) {
    operator_delete(local_6e8,local_6d8 + 1);
  }
  if (local_750 != &local_740) {
    operator_delete(local_750,local_740 + 1);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0,local_590 + 1);
  }
  if (AVar6 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_01485071;
  }
  else {
    local_70.field_2._M_allocated_capacity = local_4f8.field_2._M_allocated_capacity;
    local_70._M_dataplus._M_p = local_4f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p == &local_4f8.field_2) goto LAB_01485071;
  }
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
LAB_01485071:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != paVar28) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if (local_538 != &local_528) {
    operator_delete(local_538,local_528 + 1);
  }
  pBVar36 = local_798;
  if (AVar5 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_5f8 != &local_5e8) {
    operator_delete(local_5f8,local_5e8 + 1);
  }
  if (local_658 != &local_648) {
    operator_delete(local_658,local_648 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if (local_618 != &local_608) {
    operator_delete(local_618,local_608 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  if (local_348 != (pointer)local_338) {
    operator_delete(local_348,local_338._0_8_ + 1);
  }
  if (local_368 != (pointer)local_358) {
    operator_delete(local_368,local_358._0_8_ + 1);
  }
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,local_4c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if (local_560 != &local_550) {
    operator_delete(local_560,(long)local_550._vptr_RenderContext + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if (local_518 != local_508) {
    operator_delete(local_518,local_508[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_3c8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_3e8);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)imageData.m_size.m_data + lVar14 + -4));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  uVar19 = (**(code **)((long)*pTVar33 + 0x18))(pTVar33);
  imageData.m_tex2D.m_state = (SharedPtrStateBase *)&imageData.m_texBuffer.m_state;
  imageData.m_type = (TextureType)uVar19;
  imageData.m_size.m_data[0] = (int)((ulong)uVar19 >> 0x20);
  imageData.m_size.m_data[1] = (int)local_6c8;
  imageData.m_size.m_data[2] = (int)((ulong)local_6c8 >> 0x20);
  imageData.m_format.order = local_240;
  imageData.m_texBuffer.m_state._0_4_ = 0;
  imageData.m_tex2D.m_ptr = (Texture2D *)0x0;
  imageData.m_texCube.m_state = (SharedPtrStateBase *)0x0;
  imageData.m_texCube.m_ptr = (TextureCube *)imageData.m_tex2D.m_state;
  glu::operator<<(local_6c8,(ShaderProgram *)&initial);
  if (local_218 == false) {
    tcu::TestContext::setTestResult
              ((pBVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL
               ,"Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,local_240);
    glu::CallLogWrapper::glDispatchCompute(&glLog,local_7a8[0] * 5,local_7a8[1],local_7b4);
    lVar14 = (**(code **)((long)*pTVar33 + 0x18))(pTVar33);
    dVar10 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar10,"glDispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x810);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&imageData.m_texBuffer);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&initial);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
    operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                    shaderImageTypeStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
    operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                    shaderImageFormatStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)atomicInvocation._M_dataplus._M_p != &atomicInvocation.field_2) {
    operator_delete(atomicInvocation._M_dataplus._M_p,
                    atomicInvocation.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)atomicArgExpr._M_dataplus._M_p != &atomicArgExpr.field_2) {
    operator_delete(atomicArgExpr._M_dataplus._M_p,atomicArgExpr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)invocationCoord._M_dataplus._M_p != &invocationCoord.field_2) {
    operator_delete(invocationCoord._M_dataplus._M_p,
                    invocationCoord.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)atomicCoord._M_dataplus._M_p != &atomicCoord.field_2) {
    operator_delete(atomicCoord._M_dataplus._M_p,atomicCoord.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorVecTypeName._M_dataplus._M_p != &colorVecTypeName.field_2) {
    operator_delete(colorVecTypeName._M_dataplus._M_p,
                    colorVecTypeName.field_2._M_allocated_capacity + 1);
  }
  if (local_218 != false) {
    AVar5 = pBVar36->m_caseType;
    dVar10 = returnValueTexture.super_ObjectWrapper.m_object;
    dVar32 = returnValueTextureBuf.super_ObjectWrapper.m_object;
    if (AVar5 != ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
      dVar10 = 0xffffffff;
      dVar32 = 0xffffffff;
      if (AVar5 == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
        dVar10 = endResultTexture.super_ObjectWrapper.m_object;
        dVar32 = endResultTextureBuf.super_ObjectWrapper.m_object;
      }
    }
    imageData.m_type = (uint)(AVar5 != ATOMIC_OPERATION_CASE_TYPE_END_RESULT) * 4 + TEXTURETYPE_CUBE
    ;
    imageData.m_size.m_data[0] = 1;
    imageData.m_size.m_data[1] = 1;
    initial.m_data[0] = 0;
    initial.m_data[1] = 0;
    initial.m_data._8_8_ = initial.m_data._8_8_ & 0xffffffff00000000;
    lVar14 = 0;
    do {
      initial.m_data[lVar14] = imageData.m_size.m_data[lVar14 + -1] * local_7a8[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    if (AVar5 == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      verifyLayer = (ImageLayerVerifier *)operator_new(0x10);
      TVar3 = pBVar36->m_imageType;
      uVar13 = (ulong)TVar3;
      AVar4 = pBVar36->m_operation;
      verifyLayer->_vptr_ImageLayerVerifier = (_func_int **)&PTR_operator___02163020;
      *(AtomicOperation *)&verifyLayer[1]._vptr_ImageLayerVerifier = AVar4;
      *(TextureType *)((long)&verifyLayer[1]._vptr_ImageLayerVerifier + 4) = TVar3;
    }
    else if (AVar5 == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
      verifyLayer = (ImageLayerVerifier *)operator_new(0x18);
      uVar13._0_4_ = pBVar36->m_imageType;
      uVar13._4_4_ = pBVar36->m_operation;
      verifyLayer->_vptr_ImageLayerVerifier = (_func_int **)&PTR_operator___02163060;
      *(undefined4 *)&verifyLayer[1]._vptr_ImageLayerVerifier = uVar13._4_4_;
      *(undefined4 *)((long)&verifyLayer[1]._vptr_ImageLayerVerifier + 4) = (undefined4)uVar13;
      *(int *)&verifyLayer[2]._vptr_ImageLayerVerifier = (int)local_7a8._0_8_;
      *(int *)((long)&verifyLayer[2]._vptr_ImageLayerVerifier + 4) = SUB84(local_7a8._0_8_,4);
    }
    else {
      uVar13 = (ulong)pBVar36->m_imageType;
      verifyLayer = (ImageLayerVerifier *)0x0;
    }
    bVar8 = readTextureAndVerify
                      ((RenderContext *)local_680,&glLog,dVar10,dVar32,(TextureType)uVar13,local_150
                       ,(IVec3 *)&initial,verifyLayer);
    pcVar24 = "Image verification failed";
    if (bVar8) {
      pcVar24 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((pBVar36->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar8,
               pcVar24);
    (*verifyLayer->_vptr_ImageLayerVerifier[2])(verifyLayer);
  }
  glu::ObjectWrapper::~ObjectWrapper(&returnValueTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&endResultTexture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&returnValueTextureBuf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&endResultTextureBuf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

BinaryAtomicOperationCase::IterateResult BinaryAtomicOperationCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_imageType);
	const IVec3&				imageSize				= defaultImageSize(m_imageType);
	const int					numSlicesOrFaces		= m_imageType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const bool					isUintFormat			= isFormatTypeUnsignedInteger(m_format.type);
	const bool					isIntFormat				= isFormatTypeSignedInteger(m_format.type);
	const glu::Buffer			endResultTextureBuf		(renderCtx);
	const glu::Buffer			returnValueTextureBuf	(renderCtx);
	const glu::Texture			endResultTexture		(renderCtx); //!< Texture for the final result; i.e. the texture on which the atomic operations are done. Size imageSize.
	const glu::Texture			returnValueTexture		(renderCtx); //!< Texture into which the return values are stored if m_caseType == CASETYPE_RETURN_VALUES.
																	 //	  Size imageSize*IVec3(N, 1, 1) or, for cube maps, imageSize*IVec3(N, N, 1) where N is NUM_INVOCATIONS_PER_PIXEL.

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created a texture (name " << *endResultTexture << ") to act as the target of atomic operations" << TestLog::EndMessage;
	if (m_imageType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *endResultTextureBuf << ")" << TestLog::EndMessage;

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		log << TestLog::Message << "// Created a texture (name " << *returnValueTexture << ") to which the intermediate return values of the atomic operation are stored" << TestLog::EndMessage;
		if (m_imageType == TEXTURETYPE_BUFFER)
			log << TestLog::Message << "// Created a buffer for the texture (name " << *returnValueTextureBuf << ")" << TestLog::EndMessage;
	}

	// Fill endResultTexture with initial pattern.

	{
		const LayeredImage imageData(m_imageType, m_format, imageSize.x(), imageSize.y(), imageSize.z());

		{
			const IVec4 initial(getOperationInitialValue(m_operation));

			for (int z = 0; z < numSlicesOrFaces; z++)
			for (int y = 0; y < imageSize.y(); y++)
			for (int x = 0; x < imageSize.x(); x++)
				imageData.setPixel(x, y, z, initial);
		}

		// Upload initial pattern to endResultTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE0);
		glLog.glBindTexture(textureTargetGL, *endResultTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Filling end-result texture with initial pattern (initial value " << getOperationInitialValue(m_operation) << ")" << TestLog::EndMessage;

		uploadTexture(glLog, imageData, *endResultTextureBuf);
	}

	glLog.glBindImageTexture(0, *endResultTexture, 0, GL_TRUE, 0, GL_READ_WRITE, internalFormatGL);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		// Set storage for returnValueTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE1);
		glLog.glBindTexture(textureTargetGL, *returnValueTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Setting storage of return-value texture" << TestLog::EndMessage;
		setTextureStorage(glLog, m_imageType, internalFormatGL, imageSize * (m_imageType == TEXTURETYPE_CUBE ? IVec3(NUM_INVOCATIONS_PER_PIXEL, NUM_INVOCATIONS_PER_PIXEL,	1)
																											 : IVec3(NUM_INVOCATIONS_PER_PIXEL, 1,							1)),
						  *returnValueTextureBuf);

		glLog.glBindImageTexture(1, *returnValueTexture, 0, GL_TRUE, 0, GL_WRITE_ONLY, internalFormatGL);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");
	}

	// Perform image stores in compute shader and finalize reference computation.

	{
		// Generate compute shader.

		const string colorVecTypeName		= string(isUintFormat ? "u" : isIntFormat ? "i" : "") + "vec4";
		const string atomicCoord			= m_imageType == TEXTURETYPE_BUFFER		? "gx % " + toString(imageSize.x())
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx % " + toString(imageSize.x()) + ", gy)"
											: "ivec3(gx % " + toString(imageSize.x()) + ", gy, gz)";
		const string invocationCoord		= m_imageType == TEXTURETYPE_BUFFER		? "gx"
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx, gy)"
											: "ivec3(gx, gy, gz)";
		const string atomicArgExpr			= (isUintFormat		? "uint"
											 : isIntFormat		? ""
											 : "float")
												+ getAtomicFuncArgumentShaderStr(m_operation, "gx", "gy", "gz", IVec2(NUM_INVOCATIONS_PER_PIXEL*imageSize.x(), imageSize.y()));
		const string atomicInvocation		= string() + getAtomicOperationShaderFuncName(m_operation) + "(u_results, " + atomicCoord + ", " + atomicArgExpr + ")";
		const string shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const string shaderImageTypeStr		= getShaderImageType(m_format.type, m_imageType);
		const std::string		glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ imageAtomicExtensionShaderRequires(renderCtx)
														+ textureTypeExtensionShaderRequires(m_imageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) coherent uniform " + shaderImageTypeStr + " u_results;\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															  "layout (" + shaderImageFormatStr + ", binding=1) writeonly uniform " + shaderImageTypeStr + " u_returnValues;\n"
															: "") +
														"\n"
														"void main (void)\n"
														"{\n"
														"	int gx = int(gl_GlobalInvocationID.x);\n"
														"	int gy = int(gl_GlobalInvocationID.y);\n"
														"	int gz = int(gl_GlobalInvocationID.z);\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															"	imageStore(u_returnValues, " + invocationCoord + ", " + colorVecTypeName + "(" + atomicInvocation + "));\n"
														 : m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT ?
															"	" + atomicInvocation + ";\n"
														 : DE_NULL) +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		glLog.glDispatchCompute(NUM_INVOCATIONS_PER_PIXEL*imageSize.x(), imageSize.y(), numSlicesOrFaces);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
	}

	// Read texture and check.

	{
		const deUint32								textureToCheckGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTexture
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTexture
																		: (deUint32)-1;
		const deUint32								textureToCheckBufGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTextureBuf
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTextureBuf
																		: (deUint32)-1;

		const IVec3									textureToCheckSize	= imageSize * IVec3(m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT ? 1 : NUM_INVOCATIONS_PER_PIXEL, 1, 1);
		const UniquePtr<const ImageLayerVerifier>	verifier			(m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? new EndResultVerifier(m_operation, m_imageType)
																	   : m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES		? new ReturnValueVerifier(m_operation, m_imageType, imageSize.swizzle(0, 1))
																	   : (ImageLayerVerifier*)DE_NULL);

		if (readTextureAndVerify(renderCtx, glLog, textureToCheckGL, textureToCheckBufGL, m_imageType, m_format, textureToCheckSize, *verifier))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

		return STOP;
	}
}